

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O1

bool __thiscall
cmMarkAsAdvancedCommand::InitialPass
          (cmMarkAsAdvancedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  cmState *this_00;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  pointer pbVar9;
  uint uVar10;
  string variable;
  char *__end;
  string local_b0;
  string local_90;
  char *local_70;
  cmCommand *local_68;
  string local_60;
  char *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = &this->super_cmCommand;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar9) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"called with incorrect number of arguments","");
    cmCommand::SetError(local_68,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
LAB_0032a254:
    bVar3 = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)pbVar9);
    if ((iVar4 == 0) ||
       (iVar4 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start), iVar4 == 0)) {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      local_70 = "1";
      if (iVar4 == 0) {
        local_70 = "0";
      }
      bVar2 = true;
      uVar10 = 1;
    }
    else {
      local_70 = "1";
      uVar10 = 0;
      bVar2 = false;
    }
    uVar8 = (ulong)uVar10;
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
    bVar3 = uVar5 <= uVar8;
    if (uVar8 < uVar5) {
      local_40 = local_70 + 1;
      local_38 = args;
      do {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        uVar10 = uVar10 + 1;
        pcVar1 = pbVar9[uVar8]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + pbVar9[uVar8]._M_string_length);
        this_00 = cmMakefile::GetState(((cmCommand *)&local_68->super_cmObject)->Makefile);
        pcVar6 = cmState::GetCacheEntryValue(this_00,&local_90);
        if (pcVar6 == (char *)0x0) {
          bVar2 = true;
          cmState::AddCacheEntry(this_00,&local_90,(char *)0x0,(char *)0x0,UNINITIALIZED);
        }
        pcVar6 = cmState::GetCacheEntryValue(this_00,&local_90);
        if (pcVar6 == (char *)0x0) {
          cmSystemTools::Error("This should never happen...",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ADVANCED","");
          pcVar7 = cmState::GetCacheEntryProperty(this_00,&local_90,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (pcVar7 == (char *)0x0 || bVar2) {
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ADVANCED","");
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_70,local_40);
            cmState::SetCacheEntryProperty(this_00,&local_90,&local_b0,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (pcVar6 == (char *)0x0) goto LAB_0032a254;
        uVar8 = (ulong)uVar10;
        pbVar9 = (local_38->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(local_38->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
        bVar3 = uVar5 <= uVar8;
      } while (uVar8 < uVar5);
    }
  }
  return bVar3;
}

Assistant:

bool cmMarkAsAdvancedCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  unsigned int i =0;
  const char* value = "1";
  bool overwrite = false;
  if(args[0] == "CLEAR" || args[0] == "FORCE")
    {
    overwrite = true;
    if(args[0] == "CLEAR")
      {
      value = "0";
      }
    i = 1;
    }
  for(; i < args.size(); ++i)
    {
    std::string variable = args[i];
    cmState* state = this->Makefile->GetState();
    if (!state->GetCacheEntryValue(variable))
      {
      state->AddCacheEntry(variable, 0, 0, cmState::UNINITIALIZED);
      overwrite = true;
      }
    if (!state->GetCacheEntryValue(variable))
      {
      cmSystemTools::Error("This should never happen...");
      return false;
      }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite)
      {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
      }
    }
  return true;
}